

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall
CRegexParser::compile_char_class_expr
          (CRegexParser *this,utf8_ptr *expr,size_t *exprchars,re_machine *result_machine)

{
  long lVar1;
  bool bVar2;
  wchar_t wVar3;
  int iVar4;
  re_machine *machine;
  char *pcVar5;
  size_t sVar6;
  long *in_RDX;
  undefined8 *in_RSI;
  CRegexParser *in_RDI;
  int found;
  size_t i;
  char_class_t *cp;
  size_t curbytelen;
  size_t curcharlen;
  wchar_t delim;
  utf8_ptr start;
  int is_exclusive;
  size_t chrem;
  utf8_ptr p;
  wchar_t in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff6c;
  wchar_t in_stack_ffffffffffffff70;
  wchar_t in_stack_ffffffffffffff74;
  ulong local_70;
  char_class_t *local_68;
  long local_58;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  utf8_ptr s2;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar7;
  long local_38;
  utf8_ptr local_30 [2];
  long *local_20;
  undefined8 *local_18;
  
  local_30[0].p_ = (char *)*in_RSI;
  lVar1 = *in_RDX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_38 = lVar1 + -1;
  iVar7 = 0;
  if ((local_38 != 0) && (wVar3 = utf8_ptr::getch((utf8_ptr *)0x32f48d), wVar3 == L'^')) {
    iVar7 = 1;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_38 = lVar1 + -2;
  }
  in_RDI->range_buf_cnt_ = 0;
  do {
    utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffffb8);
    local_58 = 0;
    s2.p_ = local_30[0].p_;
    while (((local_38 != 0 &&
            (in_stack_ffffffffffffffb4 = utf8_ptr::getch((utf8_ptr *)0x32f4ee),
            in_stack_ffffffffffffffb4 != L'>')) && (in_stack_ffffffffffffffb4 != L'|'))) {
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_38 = local_38 + -1;
      local_58 = local_58 + 1;
    }
    if (local_38 == 0) {
      return 0;
    }
    machine = (re_machine *)utf8_ptr::getptr(local_30);
    pcVar5 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb8);
    sVar6 = (long)machine - (long)pcVar5;
    if (local_58 == 1) {
      utf8_ptr::getch((utf8_ptr *)0x32f57f);
      add_range_char((CRegexParser *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
    }
    else if ((local_58 == 3) &&
            (wVar3 = utf8_ptr::getch_at((utf8_ptr *)
                                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),
                                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                )), wVar3 == L'-')) {
      in_stack_ffffffffffffff74 = utf8_ptr::getch((utf8_ptr *)0x32f5b6);
      utf8_ptr::getch_at((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      add_range_char((CRegexParser *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    else {
      local_68 = compile_char_class_expr::classes;
      bVar2 = false;
      for (local_70 = 0; local_70 < 0x22; local_70 = local_70 + 1) {
        if (sVar6 == local_68->name_len) {
          utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb8);
          iVar4 = memicmp((void *)CONCAT44(iVar7,in_stack_ffffffffffffffc0),s2.p_,
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (iVar4 == 0) {
            if (local_68->code == RE_LITERAL) {
              add_range_char((CRegexParser *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff6c);
            }
            else {
              if (((in_RDI->range_buf_cnt_ == 0) && (in_stack_ffffffffffffffb4 == L'>')) &&
                 (iVar7 == 0)) {
                build_special(in_RDI,machine,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
                *local_18 = local_30[0].p_;
                *local_20 = local_38;
                return 1;
              }
              add_range_class((CRegexParser *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
            }
            bVar2 = true;
            break;
          }
        }
        local_68 = local_68 + 1;
      }
      if (!bVar2) {
        return 0;
      }
    }
    if (in_stack_ffffffffffffffb4 != L'|') {
      build_char_range(in_RDI,machine,in_stack_ffffffffffffff74);
      *local_18 = local_30[0].p_;
      *local_20 = local_38;
      return 1;
    }
    utf8_ptr::inc((utf8_ptr *)in_RDI,(size_t *)machine);
  } while( true );
}

Assistant:

int CRegexParser::compile_char_class_expr(utf8_ptr *expr, size_t *exprchars,
                                          re_machine *result_machine)
{
    /* start at the character after the '<' */
    utf8_ptr p = *expr;
    size_t chrem = *exprchars;
    p.inc();
    --chrem;

    /* presume it won't be exclusive */
    int is_exclusive = FALSE;

    /* check for an exclusion flag */
    if (chrem != 0 && p.getch() == '^')
    {
        /* note the exclusion */
        is_exclusive = TRUE;
        
        /* skip the exclusion prefix */
        p.inc();
        --chrem;
    }
    
    /* clear out the range builder buffer */
    range_buf_cnt_ = 0;
    
    /* 
     *   keep going until we find the closing delimiter (or run out of
     *   expression string) 
     */
    for (;;)
    {
        utf8_ptr start;
        wchar_t delim;
        size_t curcharlen;
        size_t curbytelen;
        
        /* remember where the current part starts */
        start = p;
        
        /* scan for the '>' or '|' */
        for (curcharlen = 0 ; chrem != 0 ; p.inc(), --chrem, ++curcharlen)
        {
            /* get the next character */
            delim = p.getch();
            
            /* if it's '>' or '|', we're done */
            if (delim == '>' || delim == '|')
                break;
        }
        
        /* 
         *   If we reached the end of the expression without finding a
         *   closing delimiter, the expression is invalid - treat the whole
         *   thing (starting with the '<') as ordinary characters.  
         */
        if (chrem == 0)
            return FALSE;
        
        /* get the length of this part */
        curbytelen = (size_t)(p.getptr() - start.getptr());
        
        /* 
         *   See what we have.  If we have a single character, it's a
         *   literal.  If we have a character, a hyphen, and another
         *   character, it's a literal range.  Otherwise, it must be one of
         *   our named classes.  
         */
        if (curcharlen == 1)
        {
            /* it's a literal - add the character */
            add_range_char(start.getch());
        }
        else if (curcharlen == 3 && start.getch_at(1) == '-')
        {
            /* it's a literal range - add it */
            add_range_char(start.getch(), start.getch_at(2));
        }
        else
        {
            struct char_class_t
            {
                /* expression name for the class */
                const char *name;
                
                /* length of the class name */
                size_t name_len;
                
                /* 
                 *   literal character, if the name represents a character
                 *   rather than a class - this is used only if code ==
                 *   RE_LITERAL 
                 */
                wchar_t ch;
                
                /* RE_xxx code for the class */
                re_recog_type code;
            };
            static const char_class_t classes[] =
            {
                { "alpha",    5, 0, RE_ALPHA },
                { "digit",    5, 0, RE_DIGIT },
                { "upper",    5, 0, RE_UPPER },
                { "lower",    5, 0, RE_LOWER },
                { "alphanum", 8, 0, RE_ALPHANUM },
                { "space",    5, 0, RE_SPACE },
                { "punct",    5, 0, RE_PUNCT },
                { "newline",  7, 0, RE_NEWLINE },
                { "vspace",   6, 0, RE_VSPACE },
                { "langle",   6, '<', RE_LITERAL },
                { "rangle",   6, '>', RE_LITERAL },
                { "vbar",     4, '|', RE_LITERAL },
                { "caret",    5, '^', RE_LITERAL },
                { "squote",   6, '\'', RE_LITERAL },
                { "dquote",   6, '"', RE_LITERAL },
                { "star",     4, '*', RE_LITERAL },
                { "question", 8, '?', RE_LITERAL },
                { "percent",  7, '%', RE_LITERAL },
                { "dot",      3, '.', RE_LITERAL },
                { "period",   6, '.', RE_LITERAL },
                { "plus",     4, '+', RE_LITERAL },
                { "lsquare",  7, '[', RE_LITERAL },
                { "rsquare",  7, ']', RE_LITERAL },
                { "lparen",   6, '(', RE_LITERAL },
                { "rparen",   6, ')', RE_LITERAL},
                { "lbrace",   6, '{', RE_LITERAL },
                { "rbrace",   6, '}', RE_LITERAL },
                { "dollar",   6, '$', RE_LITERAL },
                { "backslash",9, '\\', RE_LITERAL },
                { "return",   6, 0x000D, RE_LITERAL },
                { "linefeed", 8, 0x000A, RE_LITERAL },
                { "tab",      3, 0x0009, RE_LITERAL },
                { "nul",      3, 0x0000, RE_LITERAL },
                { "null",     4, 0x0000, RE_LITERAL }
            };
            const char_class_t *cp;
            size_t i;
            int found;

            /* scan our name list for a match */
            for (cp = classes, i = 0, found = FALSE ;
                 i < sizeof(classes)/sizeof(classes[0]) ;
                 ++i, ++cp)
            {
                /* 
                 *   if the length matches and the name matches (ignoring
                 *   case), this is the one we want 
                 */
                if (curbytelen == cp->name_len
                    && memicmp(start.getptr(), cp->name, curbytelen) == 0)
                {
                    /* 
                     *   this is it - add either a class range or literal
                     *   range, depending on the meaning of the name 
                     */
                    if (cp->code == RE_LITERAL)
                    {
                        /* it's a name for a literal */
                        add_range_char(cp->ch);
                    }
                    else
                    {
                        /* 
                         *   It's a name for a character class.  As a
                         *   special case for efficiency, if this is the one
                         *   and only thing in this class expression, don't
                         *   create a range expression but instead create a
                         *   special for the class.
                         *   
                         *   Note that we can't do this for an exclusive
                         *   class, since we don't have any special matcher
                         *   for those - implement those with a character
                         *   range as usual.  
                         */
                        if (range_buf_cnt_ == 0
                            && delim == '>'
                            && !is_exclusive)
                        {
                            /*
                             *   This is the only thing, so build a special
                             *   to match this class - this is more
                             *   efficient to store and to match than a
                             *   range expression.  
                             */
                            build_special(result_machine, cp->code, 0);
                            
                            /* skip to the '>' */
                            *expr = p;
                            *exprchars = chrem;
                            
                            /* 
                             *   we're done with the expresion - tell the
                             *   caller we were successful 
                             */
                            return TRUE;
                        }
                        else
                        {
                            /* 
                             *   it's not the only thing, so add the class
                             *   to the range list 
                             */
                            add_range_class(cp->code);
                        }
                    }
                    
                    /* note that we found a match */
                    found = TRUE;
                    
                    /* no need to scan further in our table */
                    break;
                }
            }
            
            /* if we didn't find a match, the whole expression is invalid */
            if (!found)
                return FALSE;
        }
        
        /* 
         *   if we found the '>', we're done; if we found a '|', skip it and
         *   keep going 
         */
        if (delim == '|')
        {
            /* skip the delimiter, and back for another round */
            p.inc(&chrem);
        }
        else
        {
            /* we found the '>', so we're done - add the range recognizer */
            build_char_range(result_machine, is_exclusive);
            
            /* skip up to the '>' */
            *expr = p;
            *exprchars = chrem;
            
            /* tell the caller we were successful */
            return TRUE;
        }
    }
}